

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

void __thiscall
wasm::WATParser::anon_unknown_11::WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx>
::~WithPosition(WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx> *this)

{
  WithPosition<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx> *this_local;
  
  Lexer::setIndex(&(this->ctx->in).lexer,(ulong)this->original);
  return;
}

Assistant:

~WithPosition() { ctx.in.lexer.setIndex(original); }